

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# leg_track.cpp
# Opt level: O0

void __thiscall
cp::LegTrack::init_setup
          (LegTrack *this,double sampling_time,double single_sup_time,double double_sup_time,
          double legh,Affine3d *now_leg_pose,Quat *waist_r)

{
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *this_00;
  Scalar *pSVar1;
  Quat *waist_r_local;
  Affine3d *now_leg_pose_local;
  double legh_local;
  double double_sup_time_local;
  double single_sup_time_local;
  double sampling_time_local;
  LegTrack *this_local;
  
  Pose::set((Pose *)(this + 0x450),now_leg_pose);
  Pose::set((Pose *)(this + 0x530),now_leg_pose + 1);
  Pose::set((Pose *)(this + 0x610),now_leg_pose);
  Pose::set((Pose *)(this + 0x6f0),now_leg_pose + 1);
  Pose::set((Pose *)(this + 0x260),now_leg_pose);
  Pose::set((Pose *)(this + 0x340),now_leg_pose + 1);
  this_00 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
            Pose::p((Pose *)(this + 0x450));
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z(this_00);
  *(Scalar *)(this + 0x1d8) = *pSVar1;
  Eigen::Quaternion<double,_0>::operator=((Quaternion<double,_0> *)(this + 0x200),waist_r);
  Eigen::Quaternion<double,_0>::operator=((Quaternion<double,_0> *)(this + 0x220),waist_r);
  setup(this,sampling_time,single_sup_time,double_sup_time,legh);
  return;
}

Assistant:

void LegTrack::init_setup(double sampling_time, double single_sup_time,
                          double double_sup_time, double legh,
                          const Affine3d now_leg_pose[2], const Quat& waist_r) {
  init_pose[right].set(now_leg_pose[right]);
  init_pose[left].set(now_leg_pose[left]);
  bfr_landpose[right].set(now_leg_pose[right]);
  bfr_landpose[left].set(now_leg_pose[left]);
  ref_landpose[right].set(now_leg_pose[right]);
  ref_landpose[left].set(now_leg_pose[left]);

  ground_h = init_pose[0].p().z();
  waist = waist_r;  ref_waist_r = waist_r;
  setup(sampling_time, single_sup_time, double_sup_time, legh);
}